

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_to_hex.h
# Opt level: O0

void __thiscall
fmt::v8::
formatter<spdlog::details::dump_info<__gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>_>,_char,_void>
::put_newline<fmt::v8::appender>
          (formatter<spdlog::details::dump_info<__gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>_>,_char,_void>
           *this,appender inserter,size_t pos)

{
  format_args args;
  string_view fmt;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_unsigned_long> *pfVar1;
  size_t extraout_RDX;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_2
  in_RSI;
  char *this_00;
  appender *in_RDI;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> *in_stack_ffffffffffffff00;
  basic_format_string<char,_unsigned_long_&> *in_stack_ffffffffffffff08;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_e0;
  undefined1 local_d1;
  undefined8 uVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_2
  aVar3;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> in_stack_ffffffffffffff58;
  undefined8 local_a0;
  undefined1 *local_98;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_unsigned_long> *local_78;
  undefined1 local_70 [32];
  undefined1 *local_50;
  undefined1 *local_30;
  undefined8 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined8 local_10;
  undefined8 *local_8;
  
  local_d1 = 10;
  uVar2 = in_RDI;
  local_e0.container = (buffer<char> *)appender::operator++(in_RDI,0);
  std::back_insert_iterator<fmt::v8::detail::buffer<char>_>::operator*(&local_e0);
  std::back_insert_iterator<fmt::v8::detail::buffer<char>_>::operator=
            (in_stack_ffffffffffffff00,(value_type_conflict1 *)in_RDI);
  if (((ulong)(in_RDI->super_back_insert_iterator<fmt::v8::detail::buffer<char>_>).container &
      0x100000000) != 0) {
    this_00 = "{:04X}: ";
    aVar3 = in_RSI;
    basic_format_string<char,_unsigned_long_&>::basic_format_string<char[9],_0>
              (in_stack_ffffffffffffff08,(char (*) [9])in_stack_ffffffffffffff00);
    local_78 = (format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_unsigned_long>
                *)&stack0xffffffffffffff30;
    local_50 = local_70;
    pfVar1 = make_format_args<fmt::v8::basic_format_context<fmt::v8::appender,char>,unsigned_long>
                       (local_78,(v8 *)this_00,(unsigned_long *)in_RSI.values_);
    local_28 = &local_a0;
    local_30 = &stack0xffffffffffffff48;
    local_10 = 4;
    local_a0 = 4;
    fmt.size_ = extraout_RDX;
    fmt.data_ = (char *)pfVar1;
    args.field_1.values_ = aVar3.values_;
    args.desc_ = uVar2;
    local_20 = local_30;
    local_18 = local_30;
    local_8 = local_28;
    local_98 = local_30;
    vformat_to<fmt::v8::appender,_0>((appender)in_stack_ffffffffffffff58.container,fmt,args);
  }
  return;
}

Assistant:

void put_newline(It inserter, std::size_t pos)
    {
#ifdef _WIN32
        *inserter++ = '\r';
#endif
        *inserter++ = '\n';

        if (put_positions)
        {
            fmt::format_to(inserter, "{:04X}: ", pos);
        }
    }